

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O2

long __thiscall ST::string::to_long(string *this,conversion_result *result,int base)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  char *endp;
  char *local_20;
  
  if ((this->m_buffer).m_size == 0) {
    result->m_flags = 2;
    lVar2 = 0;
  }
  else {
    lVar2 = strtol((this->m_buffer).m_chars,&local_20,base);
    pcVar1 = (this->m_buffer).m_chars;
    uVar3 = (uint)(local_20 != pcVar1);
    result->m_flags = uVar3;
    if (local_20 == pcVar1 + (this->m_buffer).m_size) {
      result->m_flags = uVar3 | 2;
    }
  }
  return lVar2;
}

Assistant:

ST_NODISCARD
        long to_long(conversion_result &result, int base = 0) const noexcept
        {
            if (empty()) {
                result.m_flags = ST::conversion_result::result_full_match;
                return 0;
            }

            char *endp;
            long value = strtol(c_str(), &endp, base);
            result.m_flags = 0;
            if (endp != c_str())
                result.m_flags |= ST::conversion_result::result_ok;
            if (endp == c_str() + size())
                result.m_flags |= ST::conversion_result::result_full_match;
            return value;
        }